

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csv_reader.cpp
# Opt level: O0

void __thiscall csv::CSVReader::CSVReader(CSVReader *this,string_view filename,CSVFormat *format)

{
  bool bVar1;
  ThreadSafeDeque<csv::CSVRow> *this_00;
  MmapParser *this_01;
  CSVFormat *pCVar2;
  string_view filename_00;
  unique_ptr<csv::internals::MmapParser,std::default_delete<csv::internals::MmapParser>>
  local_88 [8];
  string_view local_80;
  CSVGuessResult local_70;
  CSVGuessResult guess_result;
  undefined1 local_58 [8];
  string head;
  CSVFormat *format_local;
  CSVReader *this_local;
  string_view filename_local;
  
  filename_00._M_len = filename._M_str;
  pCVar2 = format;
  CSVFormat::CSVFormat(&this->_format,format);
  std::make_shared<csv::internals::ColNames>();
  std::
  unique_ptr<csv::internals::IBasicCSVParser,std::default_delete<csv::internals::IBasicCSVParser>>::
  unique_ptr<std::default_delete<csv::internals::IBasicCSVParser>,void>
            ((unique_ptr<csv::internals::IBasicCSVParser,std::default_delete<csv::internals::IBasicCSVParser>>
              *)&this->parser,(nullptr_t)0x0);
  this_00 = (ThreadSafeDeque<csv::CSVRow> *)operator_new(0xb8);
  internals::ThreadSafeDeque<csv::CSVRow>::ThreadSafeDeque(this_00,100);
  std::
  unique_ptr<csv::internals::ThreadSafeDeque<csv::CSVRow>,std::default_delete<csv::internals::ThreadSafeDeque<csv::CSVRow>>>
  ::unique_ptr<std::default_delete<csv::internals::ThreadSafeDeque<csv::CSVRow>>,void>
            ((unique_ptr<csv::internals::ThreadSafeDeque<csv::CSVRow>,std::default_delete<csv::internals::ThreadSafeDeque<csv::CSVRow>>>
              *)&this->records,this_00);
  this->n_cols = 0;
  this->_n_rows = 0;
  this->header_trimmed = false;
  std::thread::thread(&this->read_csv_worker);
  filename_00._M_str = (char *)pCVar2;
  guess_result = (CSVGuessResult)filename._M_len;
  internals::get_csv_head_abi_cxx11_((string *)local_58,(internals *)filename._M_len,filename_00);
  bVar1 = CSVFormat::guess_delim(format);
  if (bVar1) {
    local_80 = (string_view)
               std::__cxx11::string::operator_cast_to_basic_string_view((string *)local_58);
    local_70 = internals::_guess_format(local_80,&format->possible_delimiters);
    CSVFormat::delimiter(format,local_70.delim);
    format->header = local_70.header_row;
    CSVFormat::operator=(&this->_format,format);
  }
  bVar1 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::empty(&format->col_names);
  if (!bVar1) {
    set_col_names(this,&format->col_names);
  }
  this_01 = (MmapParser *)operator_new(0x5c0);
  internals::MmapParser::MmapParser(this_01,filename,format,&this->col_names);
  std::unique_ptr<csv::internals::MmapParser,std::default_delete<csv::internals::MmapParser>>::
  unique_ptr<std::default_delete<csv::internals::MmapParser>,void>(local_88,this_01);
  std::
  unique_ptr<csv::internals::IBasicCSVParser,std::default_delete<csv::internals::IBasicCSVParser>>::
  operator=((unique_ptr<csv::internals::IBasicCSVParser,std::default_delete<csv::internals::IBasicCSVParser>>
             *)&this->parser,
            (unique_ptr<csv::internals::MmapParser,_std::default_delete<csv::internals::MmapParser>_>
             *)local_88);
  std::unique_ptr<csv::internals::MmapParser,_std::default_delete<csv::internals::MmapParser>_>::
  ~unique_ptr((unique_ptr<csv::internals::MmapParser,_std::default_delete<csv::internals::MmapParser>_>
               *)local_88);
  initial_read(this);
  std::__cxx11::string::~string((string *)local_58);
  return;
}

Assistant:

CSV_INLINE CSVReader::CSVReader(csv::string_view filename, CSVFormat format) : _format(format) {
        auto head = internals::get_csv_head(filename);
        using Parser = internals::MmapParser;

        /** Guess delimiter and header row */
        if (format.guess_delim()) {
            auto guess_result = internals::_guess_format(head, format.possible_delimiters);
            format.delimiter(guess_result.delim);
            format.header = guess_result.header_row;
            this->_format = format;
        }

        if (!format.col_names.empty())
            this->set_col_names(format.col_names);

        this->parser = std::unique_ptr<Parser>(new Parser(filename, format, this->col_names)); // For C++11
        this->initial_read();
    }